

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transient_suppressor.cc
# Opt level: O1

void __thiscall
webrtc::TransientSuppressor::Suppress
          (TransientSuppressor *this,float *in_ptr,float *spectral_mean,float *out_ptr)

{
  size_t sVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  
  sVar1 = this->analysis_length_;
  if (sVar1 != 0) {
    pfVar2 = (this->fft_buffer_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
             _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    pfVar3 = this->window_;
    sVar5 = 0;
    do {
      pfVar2[sVar5] = in_ptr[sVar5] * pfVar3[sVar5];
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  WebRtc_rdft(sVar1,1,(this->fft_buffer_)._M_t.
                      super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                      super__Head_base<0UL,_float_*,_false>._M_head_impl,
              (this->ip_)._M_t.
              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,
              (this->wfft_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  sVar1 = this->analysis_length_;
  pfVar2 = (this->fft_buffer_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
           .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  pfVar2[sVar1] = pfVar2[1];
  pfVar2[sVar1 + 1] = 0.0;
  pfVar2[1] = 0.0;
  sVar1 = this->complex_analysis_length_;
  if (sVar1 != 0) {
    pfVar3 = (this->magnitudes_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
             _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    sVar5 = 0;
    do {
      pfVar3[sVar5] = ABS(pfVar2[sVar5 * 2 + 1]) + ABS(pfVar2[sVar5 * 2]);
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  if (this->suppression_enabled_ != false) {
    if (this->use_hard_restoration_ == true) {
      HardRestoration(this,spectral_mean);
    }
    else {
      SoftRestoration(this,spectral_mean);
    }
  }
  sVar1 = this->complex_analysis_length_;
  if (sVar1 != 0) {
    pfVar2 = (this->magnitudes_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
             _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    sVar5 = 0;
    do {
      spectral_mean[sVar5] = spectral_mean[sVar5] * 0.5 + pfVar2[sVar5] * 0.5;
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  sVar1 = this->analysis_length_;
  pfVar2 = (this->fft_buffer_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
           .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  pfVar2[1] = pfVar2[sVar1];
  WebRtc_rdft(sVar1,-1,pfVar2,
              (this->ip_)._M_t.
              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,
              (this->wfft_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  uVar4 = this->analysis_length_;
  if (uVar4 != 0) {
    pfVar2 = (this->fft_buffer_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
             _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    pfVar3 = this->window_;
    uVar6 = 0;
    do {
      out_ptr[uVar6] = pfVar2[uVar6] * pfVar3[uVar6] * (2.0 / (float)uVar4) + out_ptr[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  return;
}

Assistant:

void TransientSuppressor::Suppress(float* in_ptr,
                                   float* spectral_mean,
                                   float* out_ptr) {
  // Go to frequency domain.
  for (size_t i = 0; i < analysis_length_; ++i) {
    // TODO(aluebs): Rename windows
    fft_buffer_[i] = in_ptr[i] * window_[i];
  }

  WebRtc_rdft(analysis_length_, 1, fft_buffer_.get(), ip_.get(), wfft_.get());

  // Since WebRtc_rdft puts R[n/2] in fft_buffer_[1], we move it to the end
  // for convenience.
  fft_buffer_[analysis_length_] = fft_buffer_[1];
  fft_buffer_[analysis_length_ + 1] = 0.f;
  fft_buffer_[1] = 0.f;

  for (size_t i = 0; i < complex_analysis_length_; ++i) {
    magnitudes_[i] = ComplexMagnitude(fft_buffer_[i * 2],
                                      fft_buffer_[i * 2 + 1]);
  }
  // Restore audio if necessary.
  if (suppression_enabled_) {
    if (use_hard_restoration_) {
      HardRestoration(spectral_mean);
    } else {
      SoftRestoration(spectral_mean);
    }
  }

  // Update the spectral mean.
  for (size_t i = 0; i < complex_analysis_length_; ++i) {
    spectral_mean[i] = (1 - kMeanIIRCoefficient) * spectral_mean[i] +
                       kMeanIIRCoefficient * magnitudes_[i];
  }

  // Back to time domain.
  // Put R[n/2] back in fft_buffer_[1].
  fft_buffer_[1] = fft_buffer_[analysis_length_];

  WebRtc_rdft(analysis_length_,
              -1,
              fft_buffer_.get(),
              ip_.get(),
              wfft_.get());
  const float fft_scaling = 2.f / analysis_length_;

  for (size_t i = 0; i < analysis_length_; ++i) {
    out_ptr[i] += fft_buffer_[i] * window_[i] * fft_scaling;
  }
}